

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSat.c
# Opt level: O0

int Dch_NodesAreEquiv(Dch_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Aig_Obj_t *pAVar4;
  abctime clk;
  int status;
  int RetValue1;
  int RetValue;
  int pLits [2];
  int nBTLimit;
  Aig_Obj_t *pNew_local;
  Aig_Obj_t *pOld_local;
  Dch_Man_t *p_local;
  
  pLits[0] = p->pPars->nBTLimit;
  p->nSatCalls = p->nSatCalls + 1;
  unique0x10000778 = pNew;
  iVar1 = Aig_IsComplement(pNew);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,0x35,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pOld);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,0x36,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (stack0xffffffffffffffd8 == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,0x37,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  p->nCallsSince = p->nCallsSince + 1;
  if ((p->pSat == (sat_solver *)0x0) ||
     (((p->pPars->nSatVarMax != 0 && (p->pPars->nSatVarMax < p->nSatVars)) &&
      (p->pPars->nCallsRecycle < p->nCallsSince)))) {
    Dch_ManSatSolverRecycle(p);
  }
  Dch_CnfNodeAddToSolver(p,pOld);
  Dch_CnfNodeAddToSolver(p,stack0xffffffffffffffd8);
  if (p->pSat->qtail != p->pSat->qhead) {
    iVar1 = sat_solver_simplify(p->pSat);
    if (iVar1 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                    ,0x4a,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                    ,0x4b,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  iVar1 = Dch_ObjSatNum(p,pOld);
  RetValue1 = toLitCond(iVar1,0);
  iVar1 = Dch_ObjSatNum(p,stack0xffffffffffffffd8);
  RetValue = toLitCond(iVar1,(uint)(((uint)(*(ulong *)&pOld->field_0x18 >> 3) & 1) ==
                                   ((uint)(*(ulong *)&stack0xffffffffffffffd8->field_0x18 >> 3) & 1)
                                   ));
  if (p->pPars->fPolarFlip != 0) {
    if ((*(ulong *)&pOld->field_0x18 >> 3 & 1) != 0) {
      RetValue1 = lit_neg(RetValue1);
    }
    if ((*(ulong *)&stack0xffffffffffffffd8->field_0x18 >> 3 & 1) != 0) {
      RetValue = lit_neg(RetValue);
    }
  }
  aVar2 = Abc_Clock();
  iVar1 = sat_solver_solve(p->pSat,&RetValue1,pLits,(long)pLits[0],0,0,0);
  aVar3 = Abc_Clock();
  p->timeSat = (aVar3 - aVar2) + p->timeSat;
  if (iVar1 == -1) {
    aVar3 = Abc_Clock();
    p->timeSatUnsat = (aVar3 - aVar2) + p->timeSatUnsat;
    RetValue1 = lit_neg(RetValue1);
    RetValue = lit_neg(RetValue);
    iVar1 = sat_solver_addclause(p->pSat,&RetValue1,pLits);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                    ,0x62,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    pAVar4 = Aig_ManConst1(p->pAigFraig);
    if (pOld == pAVar4) {
      p->nSatProof = p->nSatProof + 1;
      p_local._4_4_ = 1;
    }
    else {
      iVar1 = Dch_ObjSatNum(p,pOld);
      RetValue1 = toLitCond(iVar1,1);
      iVar1 = Dch_ObjSatNum(p,stack0xffffffffffffffd8);
      RetValue = toLitCond(iVar1,(uint)(*(ulong *)&pOld->field_0x18 >> 3) & 1 ^
                                 (uint)(*(ulong *)&stack0xffffffffffffffd8->field_0x18 >> 3) & 1);
      if (p->pPars->fPolarFlip != 0) {
        if ((*(ulong *)&pOld->field_0x18 >> 3 & 1) != 0) {
          RetValue1 = lit_neg(RetValue1);
        }
        if ((*(ulong *)&stack0xffffffffffffffd8->field_0x18 >> 3 & 1) != 0) {
          RetValue = lit_neg(RetValue);
        }
      }
      aVar2 = Abc_Clock();
      iVar1 = sat_solver_solve(p->pSat,&RetValue1,pLits,(long)pLits[0],0,0,0);
      aVar3 = Abc_Clock();
      p->timeSat = (aVar3 - aVar2) + p->timeSat;
      if (iVar1 == -1) {
        aVar3 = Abc_Clock();
        p->timeSatUnsat = (aVar3 - aVar2) + p->timeSatUnsat;
        RetValue1 = lit_neg(RetValue1);
        RetValue = lit_neg(RetValue);
        iVar1 = sat_solver_addclause(p->pSat,&RetValue1,pLits);
        if (iVar1 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                        ,0x8c,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
        p->nSatProof = p->nSatProof + 1;
        p_local._4_4_ = 1;
      }
      else if (iVar1 == 1) {
        aVar3 = Abc_Clock();
        p->timeSatSat = (aVar3 - aVar2) + p->timeSatSat;
        p->nSatCallsSat = p->nSatCallsSat + 1;
        p_local._4_4_ = 0;
      }
      else {
        aVar3 = Abc_Clock();
        p->timeSatUndec = (aVar3 - aVar2) + p->timeSatUndec;
        p->nSatFailsReal = p->nSatFailsReal + 1;
        p_local._4_4_ = -1;
      }
    }
  }
  else if (iVar1 == 1) {
    aVar3 = Abc_Clock();
    p->timeSatSat = (aVar3 - aVar2) + p->timeSatSat;
    p->nSatCallsSat = p->nSatCallsSat + 1;
    p_local._4_4_ = 0;
  }
  else {
    aVar3 = Abc_Clock();
    p->timeSatUndec = (aVar3 - aVar2) + p->timeSatUndec;
    p->nSatFailsReal = p->nSatFailsReal + 1;
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Runs equivalence test for the two nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dch_NodesAreEquiv( Dch_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{
    int nBTLimit = p->pPars->nBTLimit;
    int pLits[2], RetValue, RetValue1, status;
    abctime clk;
    p->nSatCalls++;

    // sanity checks
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    p->nCallsSince++;  // experiment with this!!!
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Dch_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
    Dch_CnfNodeAddToSolver( p, pOld );
    Dch_CnfNodeAddToSolver( p, pNew );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    pLits[0] = toLitCond( Dch_ObjSatNum(p,pOld), 0 );
    pLits[1] = toLitCond( Dch_ObjSatNum(p,pNew), pOld->fPhase == pNew->fPhase );
    if ( p->pPars->fPolarFlip )
    {
        if ( pOld->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( pNew->fPhase )  pLits[1] = lit_neg( pLits[1] );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatFailsReal++;
        return -1;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == Aig_ManConst1(p->pAigFraig) )
    {
        p->nSatProof++;
        return 1;
    }

    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
    pLits[0] = toLitCond( Dch_ObjSatNum(p,pOld), 1 );
    pLits[1] = toLitCond( Dch_ObjSatNum(p,pNew), pOld->fPhase ^ pNew->fPhase );
    if ( p->pPars->fPolarFlip )
    {
        if ( pOld->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( pNew->fPhase )  pLits[1] = lit_neg( pLits[1] );
    }
clk = Abc_Clock();
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatFailsReal++;
        return -1;
    }
    // return SAT proof
    p->nSatProof++;
    return 1;
}